

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O1

TypeDescriptor * greatThanEqOperator(TypeDescriptor *leftValue,TypeDescriptor *rightValue)

{
  pointer pcVar1;
  uint uVar2;
  NumberDescriptor *pNVar3;
  ulong uVar4;
  ostream *poVar5;
  double value;
  long *local_68;
  ulong local_60;
  long local_58 [2];
  long *local_48;
  ulong local_40;
  long local_38 [2];
  
  if (leftValue->_type == STRING) {
    if (rightValue->_type == STRING) {
      pNVar3 = (NumberDescriptor *)operator_new(0x60);
      pcVar1 = (leftValue->_string)._M_dataplus._M_p;
      local_48 = local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar1,pcVar1 + (leftValue->_string)._M_string_length);
      pcVar1 = (rightValue->_string)._M_dataplus._M_p;
      local_68 = local_58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar1,pcVar1 + (rightValue->_string)._M_string_length);
      uVar4 = local_40;
      if (local_60 < local_40) {
        uVar4 = local_60;
      }
      if (uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        uVar2 = memcmp(local_48,local_68,uVar4);
        uVar4 = (ulong)uVar2;
      }
      if ((int)uVar4 == 0) {
        uVar4 = 0xffffffff80000000;
        if (-0x80000000 < (long)(local_40 - local_60)) {
          uVar4 = local_40 - local_60;
        }
        if (0x7ffffffe < (long)uVar4) {
          uVar4 = 0x7fffffff;
        }
      }
      if ((int)uVar4 < 0) {
        value = 0.0;
      }
      else {
        value = 1.0;
      }
      NumberDescriptor::NumberDescriptor(pNVar3,value);
      if (local_68 != local_58) {
        operator_delete(local_68,local_58[0] + 1);
      }
      if (local_48 != local_38) {
        operator_delete(local_48,local_38[0] + 1);
      }
      return &pNVar3->super_TypeDescriptor;
    }
  }
  else if ((leftValue->_type == NUMBER) && (rightValue->_type == NUMBER)) {
    pNVar3 = (NumberDescriptor *)operator_new(0x60);
    NumberDescriptor::NumberDescriptor
              (pNVar3,(double)(-(ulong)(rightValue->_number <= leftValue->_number) &
                              0x3ff0000000000000));
    return &pNVar3->super_TypeDescriptor;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Unknown type. Terminating...");
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(2);
}

Assistant:

TypeDescriptor *greatThanEqOperator(TypeDescriptor *leftValue, TypeDescriptor *rightValue){
    if(leftValue->type() == TypeDescriptor::NUMBER
    && rightValue->type() == TypeDescriptor::NUMBER){
        auto *numGreaterEq = new  NumberDescriptor(leftValue->getNumber() >= rightValue->getNumber() ? 1.0 : 0.0);
        //std::cout << "TypeDescriptor *greatThanEqOperator: " << leftValue->getNumber() << " >= " << rightValue->getNumber() << std::endl;
        return numGreaterEq;
    }else if(leftValue->type() == TypeDescriptor::STRING
    && rightValue->type() == TypeDescriptor::STRING ){
        auto *stringGreaterEq = new  NumberDescriptor(leftValue->getString()  >= rightValue->getString()  ? 1.0 : 0.0);
        //std::cout << "TypeDescriptor *greatThanEqOperator: " << leftValue->getString()  << " >= " << rightValue->getString()  << std::endl;
        return stringGreaterEq;
    }else{
        std::cout << "Unknown type. Terminating..." << std::endl;
        exit(2);
    }
}